

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O0

void __thiscall
bgui::ListImageWindow::ListImageWindow
          (ListImageWindow *this,double init_min,double init_max,double valid_min,double valid_max,
          keep k,mapping m,int c)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  string *in_stack_ffffffffffffff78;
  ImageWindow *this_00;
  undefined8 *puVar1;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ListImageWindow *in_stack_ffffffffffffffa0;
  string local_58 [8];
  ImageWindow *in_stack_ffffffffffffffb0;
  
  ImageWindow::ImageWindow(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__ListImageWindow_00146ad0;
  this_00 = (ImageWindow *)(in_RDI + 0xb);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1362f6);
  puVar1 = in_RDI + 0xe;
  std::vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>::vector
            ((vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_> *)0x136309
            );
  (anonymous_namespace)::createHelpText_abi_cxx11_();
  ImageWindow::addHelpText(this_00,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_58);
  *(undefined4 *)(in_RDI + 0x11) = 0;
  in_RDI[0x12] = in_XMM0_Qa;
  in_RDI[0x13] = in_XMM1_Qa;
  in_RDI[0x14] = in_XMM2_Qa;
  in_RDI[0x15] = in_XMM3_Qa;
  *(undefined4 *)(in_RDI + 0x16) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xb4) = in_EDX;
  *(undefined4 *)(in_RDI + 0x17) = in_ECX;
  set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
      (int)((ulong)puVar1 >> 0x20),SUB81((ulong)puVar1 >> 0x18,0));
  return;
}

Assistant:

ListImageWindow::ListImageWindow(double init_min, double init_max,
                                 double valid_min, double valid_max, keep k, mapping m, int c)
{
  addHelpText(createHelpText());

  current=0;

  imin=init_min;
  imax=init_max;
  vmin=valid_min;
  vmax=valid_max;
  kp=k;
  map=m;
  channel=c;

  set(-1, 0, 0, false);
}